

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

int ixxx::posix::execv(char *__path,char **__argv)

{
  int iVar1;
  execv_error *this;
  int *piVar2;
  
  iVar1 = ::execv(__path,__argv);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (execv_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  execv_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&execv_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

void execv(const char *path, char *const *argv)
    {
        int r = ::execv(path, argv);
        if (r == -1)
            throw execv_error(errno);
    }